

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

int __thiscall OpenMD::StringTokenizer::countTokens(StringTokenizer *this)

{
  bool bVar1;
  StringTokenizer *in_RDI;
  int numToken;
  const_iterator tmpIter;
  undefined6 in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffde;
  char in_stack_ffffffffffffffdf;
  int local_14;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10 [2];
  
  local_10[0]._M_current = (in_RDI->currentPos_)._M_current;
  local_14 = 0;
  while( true ) {
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffdf,
                                     CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)))
      ;
      in_stack_ffffffffffffffdf = false;
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(local_10);
        in_stack_ffffffffffffffdf = isDelimiter(in_RDI,in_stack_ffffffffffffffdf);
      }
      if ((bool)in_stack_ffffffffffffffdf == false) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_10);
      if ((in_RDI->returnTokens_ & 1U) != 0) {
        local_14 = local_14 + 1;
      }
    }
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(ulong)CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8));
    if (bVar1) break;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffdf,
                                     CONCAT16(in_stack_ffffffffffffffde,in_stack_ffffffffffffffd8)))
      ;
      in_stack_ffffffffffffffde = 0;
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(local_10);
        bVar1 = isDelimiter(in_RDI,in_stack_ffffffffffffffdf);
        in_stack_ffffffffffffffde = bVar1 ^ 0xff;
      }
      if ((in_stack_ffffffffffffffde & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_10);
    }
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

int StringTokenizer::countTokens() {
    std::string::const_iterator tmpIter = currentPos_;
    int numToken                        = 0;

    while (true) {
      // skip delimiter first
      while (tmpIter != end_ && isDelimiter(*tmpIter)) {
        ++tmpIter;

        if (returnTokens_) {
          // if delimiter is consider as token
          ++numToken;
        }
      }

      if (tmpIter == end_) { break; }

      // encount a token here
      while (tmpIter != end_ && !isDelimiter(*tmpIter)) {
        ++tmpIter;
      }

      ++numToken;
    }

    return numToken;
  }